

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::SparseTexture2CommitmentTestCase::sparseAllocateTexture
          (SparseTexture2CommitmentTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint levels)

{
  Functions *gl_00;
  GLenum GVar1;
  int levels_00;
  ostream *poVar2;
  int local_30;
  int local_2c;
  GLint maxLevels;
  GLint levels_local;
  GLuint *texture_local;
  GLint format_local;
  GLint target_local;
  Functions *gl_local;
  SparseTexture2CommitmentTestCase *this_local;
  
  local_2c = levels;
  _maxLevels = texture;
  texture_local._0_4_ = format;
  texture_local._4_4_ = target;
  _format_local = gl;
  gl_local = (Functions *)this;
  poVar2 = std::operator<<((ostream *)&(this->super_SparseTextureCommitmentTestCase).field_0x88,
                           "Sparse Allocate [levels: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_2c);
  std::operator<<(poVar2,"] - ");
  (*(this->super_SparseTextureCommitmentTestCase).super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode[7])
            (this,_format_local,(ulong)texture_local._4_4_,(ulong)(uint)texture_local,_maxLevels);
  (*_format_local->texParameteri)(texture_local._4_4_,0x91a6,1);
  GVar1 = (*_format_local->getError)();
  glu::checkError(GVar1,"texParameteri error occurred for GL_TEXTURE_SPARSE_ARB",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                  ,0x38f);
  (*_format_local->getTexParameteriv)(texture_local._4_4_,0x91aa,&local_30);
  GVar1 = (*_format_local->getError)();
  glu::checkError(GVar1,"glGetTexParameteriv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                  ,0x391);
  gl_00 = _format_local;
  GVar1 = texture_local._4_4_;
  if (local_30 < local_2c) {
    local_2c = local_30;
  }
  if (((texture_local._4_4_ == 0x84f5) || (texture_local._4_4_ == 0x9100)) ||
     (texture_local._4_4_ == 0x9102)) {
    (this->super_SparseTextureCommitmentTestCase).mState.levels = 1;
  }
  else {
    (this->super_SparseTextureCommitmentTestCase).mState.levels = local_2c;
  }
  if ((texture_local._4_4_ == 0x9100) || (texture_local._4_4_ == 0x9102)) {
    (this->super_SparseTextureCommitmentTestCase).mState.samples = 2;
  }
  else {
    (this->super_SparseTextureCommitmentTestCase).mState.samples = 1;
  }
  levels_00 = ::deMax32((this->super_SparseTextureCommitmentTestCase).mState.levels,
                        (this->super_SparseTextureCommitmentTestCase).mState.samples);
  gl4cts::Texture::Storage
            (gl_00,GVar1,levels_00,(uint)texture_local,
             (this->super_SparseTextureCommitmentTestCase).mState.width,
             (this->super_SparseTextureCommitmentTestCase).mState.height,
             (this->super_SparseTextureCommitmentTestCase).mState.depth);
  GVar1 = (*_format_local->getError)();
  glu::checkError(GVar1,"TexStorage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                  ,0x3a7);
  return true;
}

Assistant:

bool SparseTexture2CommitmentTestCase::sparseAllocateTexture(const Functions& gl, GLint target, GLint format,
															 GLuint& texture, GLint levels)
{
	mLog << "Sparse Allocate [levels: " << levels << "] - ";

	prepareTexture(gl, target, format, texture);

	GLint maxLevels;
	gl.texParameteri(target, GL_TEXTURE_SPARSE_ARB, GL_TRUE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "texParameteri error occurred for GL_TEXTURE_SPARSE_ARB");
	gl.getTexParameteriv(target, GL_NUM_SPARSE_LEVELS_ARB, &maxLevels);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexParameteriv");
	if (levels > maxLevels)
		levels = maxLevels;

	//GL_TEXTURE_RECTANGLE, GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_2D_MULTISAMPLE_ARRAY can have only one level
	if (target != GL_TEXTURE_RECTANGLE && target != GL_TEXTURE_2D_MULTISAMPLE &&
		target != GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
	{
		mState.levels = levels;
	}
	else
		mState.levels = 1;

	if (target != GL_TEXTURE_2D_MULTISAMPLE && target != GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
	{
		mState.samples = 1;
	}
	else
		mState.samples = 2;

	Texture::Storage(gl, target, deMax32(mState.levels, mState.samples), format, mState.width, mState.height,
					 mState.depth);
	GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage");

	return true;
}